

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_significand<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point)

{
  size_t sVar1;
  basic_appender<char> bVar2;
  ulong uVar3;
  
  bVar2 = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                    (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    uVar3 = (bVar2.container)->size_ + 1;
    if ((bVar2.container)->capacity_ < uVar3) {
      (*(bVar2.container)->grow_)(bVar2.container,uVar3);
    }
    sVar1 = (bVar2.container)->size_;
    (bVar2.container)->size_ = sVar1 + 1;
    (bVar2.container)->ptr_[sVar1] = decimal_point;
    bVar2 = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                      (significand + integral_size,significand + significand_size,bVar2);
    return (basic_appender<char>)bVar2.container;
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_noinline<Char>(significand, significand + integral_size,
                                    out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_noinline<Char>(significand + integral_size,
                                     significand + significand_size, out);
}